

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

void __thiscall Wasm::WasmBinaryReader::BrTableNode(WasmBinaryReader *this)

{
  uint32 *puVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  WasmBinaryReader *this_00;
  uint32 i;
  ulong uVar5;
  uint32 local_2c [2];
  uint32 len;
  
  local_2c[0] = 0;
  this_00 = this;
  uVar2 = LEB128<unsigned_int,32u>(this,local_2c);
  (this->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets = uVar2;
  if ((1000000 < uVar2) && (DAT_01430302 == '\0')) {
    ThrowDecodingError(this_00,L"br_table too big");
  }
  puVar1 = &(this->m_funcState).count;
  *puVar1 = *puVar1 + local_2c[0];
  uVar5 = 0;
  puVar4 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                     ((Memory *)this->m_alloc,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (ulong)uVar2);
  (this->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable = puVar4;
  while( true ) {
    uVar2 = (this->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
    uVar3 = LEB128<unsigned_int,32u>(this,local_2c);
    if (uVar2 <= uVar5) break;
    (this->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable[uVar5] = uVar3;
    puVar1 = &(this->m_funcState).count;
    *puVar1 = *puVar1 + local_2c[0];
    uVar5 = uVar5 + 1;
  }
  (this->super_WasmReaderBase).m_currentNode.field_1.brTable.defaultTarget = uVar3;
  puVar1 = &(this->m_funcState).count;
  *puVar1 = *puVar1 + local_2c[0];
  return;
}

Assistant:

void WasmBinaryReader::BrTableNode()
{
    uint32 len = 0;
    m_currentNode.brTable.numTargets = LEB128(len);
    if (m_currentNode.brTable.numTargets > Limits::GetMaxBrTableElems())
    {
        ThrowDecodingError(_u("br_table too big"));
    }
    m_funcState.count += len;
    m_currentNode.brTable.targetTable = AnewArray(m_alloc, uint32, m_currentNode.brTable.numTargets);

    for (uint32 i = 0; i < m_currentNode.brTable.numTargets; i++)
    {
        m_currentNode.brTable.targetTable[i] = LEB128(len);
        m_funcState.count += len;
    }
    m_currentNode.brTable.defaultTarget = LEB128(len);
    m_funcState.count += len;
}